

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O3

DTDEntityDecl * __thiscall xercesc_4_0::DTDGrammar::getEntityDecl(DTDGrammar *this,XMLCh *entName)

{
  NameIdPool<xercesc_4_0::DTDEntityDecl> *pNVar1;
  bool bVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  long *plVar6;
  RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *pRVar7;
  StringHasher *this_00;
  
  if (*(long *)(fDefaultEntities + 0x18) != 0) {
    if ((entName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*entName, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar5 = entName[1];
      if (XVar5 != L'\0') {
        pXVar4 = entName + 2;
        do {
          uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar5 = *pXVar4;
          pXVar4 = pXVar4 + 1;
        } while (XVar5 != L'\0');
      }
      uVar3 = uVar3 % *(ulong *)(fDefaultEntities + 0x38);
    }
    plVar6 = *(long **)(*(long *)(fDefaultEntities + 0x30) + uVar3 * 8);
    if (plVar6 != (long *)0x0) {
      this_00 = (StringHasher *)(fDefaultEntities + 0x50);
      do {
        bVar2 = StringHasher::equals(this_00,entName,(void *)plVar6[2]);
        if (bVar2) {
          if ((DTDEntityDecl *)*plVar6 != (DTDEntityDecl *)0x0) {
            return (DTDEntityDecl *)*plVar6;
          }
          break;
        }
        plVar6 = (long *)plVar6[1];
      } while (plVar6 != (long *)0x0);
    }
  }
  pNVar1 = this->fEntityDeclPool;
  if (pNVar1->fIdCounter != 0) {
    if ((entName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*entName, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar5 = entName[1];
      if (XVar5 != L'\0') {
        pXVar4 = entName + 2;
        do {
          uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar5 = *pXVar4;
          pXVar4 = pXVar4 + 1;
        } while (XVar5 != L'\0');
      }
      uVar3 = uVar3 % (pNVar1->fBucketList).fHashModulus;
    }
    pRVar7 = (pNVar1->fBucketList).fBucketList[uVar3];
    if (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0) {
      do {
        bVar2 = StringHasher::equals
                          ((StringHasher *)&(pNVar1->fBucketList).field_0x30,entName,pRVar7->fKey);
        if (bVar2) {
          return pRVar7->fData;
        }
        pRVar7 = pRVar7->fNext;
      } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0);
      return (DTDEntityDecl *)0x0;
    }
  }
  return (DTDEntityDecl *)0x0;
}

Assistant:

inline DTDEntityDecl* DTDGrammar::getEntityDecl(const XMLCh* const entName)
{
    DTDEntityDecl* decl = fDefaultEntities->getByKey(entName);

    if (!decl)
        return fEntityDeclPool->getByKey(entName);

    return decl;
}